

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O2

int __thiscall Indexing::ClauseCodeTree::remove(ClauseCodeTree *this,char *__filename)

{
  __uniq_ptr_data<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>,_true,_true>
  *p_Var1;
  LitInfo *pLVar2;
  bool bVar3;
  int extraout_EAX;
  ulong uVar4;
  int iVar5;
  long lVar6;
  _Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false> this_00;
  ulong uVar7;
  CodeOp *pCVar8;
  uint uVar9;
  Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  firstsInBlocks;
  Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  rrlm;
  Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  rlms;
  Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_88;
  LitInfo local_78;
  Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_60;
  Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  local_50;
  Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
  local_40;
  uint uVar10;
  
  if (remove(Kernel::Clause*)::lInfos == '\0') {
    iVar5 = __cxa_guard_acquire(&remove(Kernel::Clause*)::lInfos);
    if (iVar5 != 0) {
      remove::lInfos._size = 0;
      remove::lInfos._capacity = 0;
      remove::lInfos._array = (LitInfo *)0x0;
      __cxa_atexit(Lib::DArray<Indexing::CodeTree::LitInfo>::~DArray,&remove::lInfos,&__dso_handle);
      __cxa_guard_release(&remove(Kernel::Clause*)::lInfos);
    }
  }
  Lib::
  Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_88);
  Lib::
  Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_60);
  uVar4 = *(ulong *)(__filename + 0x38);
  uVar10 = (uint)uVar4;
  uVar9 = uVar10 & 0xfffff;
  Lib::DArray<Indexing::CodeTree::LitInfo>::ensure(&remove::lInfos,(ulong)uVar9);
  if ((uVar4 & 0xfffff) != 0) {
    uVar4 = (ulong)(uVar10 & 0xfffff);
    lVar6 = 0;
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      CodeTree::LitInfo::LitInfo(&local_78,(Clause *)__filename,(uint)uVar7);
      pLVar2 = remove::lInfos._array;
      (&(remove::lInfos._array)->opposite)[lVar6] = local_78.opposite;
      p_Var1 = (__uniq_ptr_data<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>,_true,_true>
                *)((long)&pLVar2->liIndex + lVar6);
      p_Var1->
      super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
           = (__uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
              )local_78._0_8_;
      ((_Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
        *)(p_Var1 + 1))->
      super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false> =
           (_Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>)local_78.ft;
      *(uint *)((long)&(remove::lInfos._array)->liIndex + lVar6) = (uint)uVar7;
      lVar6 = lVar6 + 0x18;
    }
    CodeTree::incTimeStamp(&this->super_CodeTree);
    pCVar8 = (CodeOp *)((this->super_CodeTree)._entryPoint + 8);
    Lib::Stack<Indexing::CodeTree::CodeOp_*>::push
              ((Stack<Indexing::CodeTree::CodeOp_*> *)
               local_88._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>.
               _M_head_impl,pCVar8);
    iVar5 = 0;
    do {
      Lib::
      Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
      ::Recycled((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                  *)&local_78);
      this_00._M_head_impl = (RemovingLiteralMatcher *)local_78._0_8_;
      RemovingLiteralMatcher::init((RemovingLiteralMatcher *)local_78._0_8_,(EVP_PKEY_CTX *)pCVar8);
      local_50._self._M_t.
      super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      ._M_t.
      super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
      .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>._M_head_impl
           = (__uniq_ptr_data<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>,_true,_true>
              )(__uniq_ptr_data<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>,_true,_true>
                )local_78._0_8_;
      local_78._0_8_ =
           (__uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
            )0x0;
      Lib::
      Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
      ::push((Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
              *)local_60._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                ._M_head_impl,&local_50);
      Lib::
      Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_50);
      Lib::
      Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
      ::~Recycled((Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                   *)&local_78);
      while( true ) {
        do {
          while( true ) {
            bVar3 = CodeTree::RemovingMatcher<false>::next
                              (&(this_00._M_head_impl)->super_RemovingMatcher<false>);
            if (bVar3) break;
            Lib::
            Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
            ::pop(&local_40,
                  (Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>
                   *)local_60._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                     .
                     super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                     ._M_head_impl);
            Lib::
            Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
            ::~Recycled(&local_40);
            iVar5 = iVar5 + -1;
            this_00._M_head_impl =
                 (*(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
                    **)((long)local_60._self._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_std::default_delete<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_>_>
                              .
                              super__Head_base<0UL,_Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>_*,_false>
                              ._M_head_impl + 0x10))[-1]._self._M_t.
                 super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                 .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
                 _M_head_impl;
          }
          pCVar8 = ((this_00._M_head_impl)->super_RemovingMatcher<false>).super_BaseMatcher.op;
          uVar7 = pCVar8->_content >> 3;
          uVar10 = (this->super_CodeTree)._curTimeStamp;
        } while (*(uint *)(uVar7 + 0x30) == uVar10);
        pCVar8 = pCVar8 + 1;
        *(uint *)(uVar7 + 0x30) = uVar10;
        if (iVar5 != uVar9 - 1) break;
        bVar3 = removeOneOfAlternatives
                          (this,pCVar8,(Clause *)__filename,
                           (Stack<Indexing::CodeTree::CodeOp_*> *)
                           local_88._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>
                           ._M_head_impl);
        if (bVar3) {
          for (lVar6 = 0; uVar4 * 0x18 - lVar6 != 0; lVar6 = lVar6 + 0x18) {
            CodeTree::LitInfo::dispose((LitInfo *)((long)&(remove::lInfos._array)->liIndex + lVar6))
            ;
          }
          goto LAB_0026b66f;
        }
      }
      iVar5 = iVar5 + 1;
    } while( true );
  }
  pCVar8 = (CodeOp *)((this->super_CodeTree)._entryPoint + 8);
  Lib::Stack<Indexing::CodeTree::CodeOp_*>::push
            ((Stack<Indexing::CodeTree::CodeOp_*> *)
             local_88._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
             .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>._M_head_impl,
             pCVar8);
  removeOneOfAlternatives
            (this,pCVar8,(Clause *)__filename,
             (Stack<Indexing::CodeTree::CodeOp_*> *)
             local_88._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_std::default_delete<Lib::Stack<Indexing::CodeTree::CodeOp_*>_>_>
             .super__Head_base<0UL,_Lib::Stack<Indexing::CodeTree::CodeOp_*>_*,_false>._M_head_impl)
  ;
LAB_0026b66f:
  Lib::
  Recycled<Lib::Stack<Lib::Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_60);
  Lib::
  Recycled<Lib::Stack<Indexing::CodeTree::CodeOp_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_88);
  return extraout_EAX;
}

Assistant:

void ClauseCodeTree::remove(Clause* cl)
{
  static DArray<LitInfo> lInfos;
  Recycled<Stack<CodeOp*>> firstsInBlocks;
  Recycled<Stack<Recycled<RemovingLiteralMatcher, NoReset>>> rlms;

  unsigned clen=cl->length();
  lInfos.ensure(clen);

  if(!clen) {
    CodeOp* op=getEntryPoint();
    firstsInBlocks->push(op);
    if(!removeOneOfAlternatives(op, cl, &*firstsInBlocks)) {
      ASSERTION_VIOLATION;
      INVALID_OPERATION("empty clause to be removed was not found");
    }
    return;
  }

  for(unsigned i=0;i<clen;i++) {
    lInfos[i]=LitInfo(cl,i);
    lInfos[i].liIndex=i;
  }
  incTimeStamp();

  CodeOp* op=getEntryPoint();
  firstsInBlocks->push(op);
  unsigned depth=0;
  for(;;) {
    RemovingLiteralMatcher* rlm = 0;
    {
      Recycled<RemovingLiteralMatcher, NoReset> rrlm; // take rlm out of recycling
      rlm = &*rrlm; // get the actual content (also to use after this initialization block)
      rlm->init(op, lInfos.array(), lInfos.size(), this, &*firstsInBlocks); // init it
      rlms->push(std::move(rrlm)); // store it in rlms (along with the obligation to return to recycling when no longer used)
    }

  iteration_restart:
    if(!rlm->next()) {
      if(depth==0) {
        ASSERTION_VIOLATION;
        INVALID_OPERATION("clause to be removed was not found");
      }
      rlms->pop();
      depth--;
      rlm = &*rlms->top();
      goto iteration_restart;
    }

    op=rlm->op;
    ASS(op->isLitEnd());
    ASS_EQ(op->getILS()->depth, depth);

    if(op->getILS()->timestamp==_curTimeStamp) {
      //we have already been here
      goto iteration_restart;
    }
    op->getILS()->timestamp=_curTimeStamp;

    op++;
    if(depth==clen-1) {
      if(removeOneOfAlternatives(op, cl, &*firstsInBlocks)) {
        //successfully removed
        break;
      }
      goto iteration_restart;
    }
    ASS_L(depth,clen-1);
    depth++;
  }

  for(unsigned i=0;i<clen;i++) {
    lInfos[i].dispose();
  }
}